

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfig.cpp
# Opt level: O0

void __thiscall
SoundConfig::readSettings(SoundConfig *this,QSettings *settings,AudioEnumerator *enumerator)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QDebug *pQVar4;
  QVariant local_1f8;
  QVariant local_1d8;
  QVariant local_1b8;
  QVariant local_198;
  QVariant local_178;
  QVariant local_158;
  QMessageLogger local_138;
  QDebug local_118;
  int local_10c;
  undefined1 local_108 [4];
  int device;
  undefined1 local_e8 [8];
  QVariant deviceId;
  QDebug local_a8;
  QStringList local_a0;
  int local_88;
  int backend;
  QVariant local_78;
  QVariant local_58;
  undefined1 local_38 [8];
  QString api;
  AudioEnumerator *enumerator_local;
  QSettings *settings_local;
  SoundConfig *this_local;
  
  api.d.size = (qsizetype)enumerator;
  QSettings::beginGroup((QString *)settings);
  QVariant::QVariant(&local_78);
  QSettings::value((QString *)&local_58,(QVariant *)settings);
  QVariant::toString();
  QVariant::~QVariant(&local_58);
  QVariant::~QVariant(&local_78);
  bVar1 = QString::isEmpty((QString *)local_38);
  if (bVar1) {
    local_88 = 0;
  }
  else {
    AudioEnumerator::backendNames(&local_a0,(AudioEnumerator *)api.d.size);
    qVar3 = QListSpecialMethods<QString>::indexOf
                      ((QListSpecialMethods<QString> *)&local_a0,(QString *)local_38,0);
    local_88 = (int)qVar3;
    QList<QString>::~QList(&local_a0);
    if (local_88 == -1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)&deviceId.d.field_0x18,(char *)0x0,0,(char *)0x0);
      QMessageLogger::warning();
      pQVar4 = QDebug::noquote(&local_a8);
      pQVar4 = QDebug::operator<<(pQVar4,"[SoundConfig]");
      pQVar4 = QDebug::operator<<(pQVar4,"audio API");
      pQVar4 = QDebug::operator<<(pQVar4,(QString *)local_38);
      QDebug::operator<<(pQVar4,"not available");
      QDebug::~QDebug(&local_a8);
      local_88 = 0;
    }
  }
  setBackendIndex(this,local_88);
  AudioEnumerator::populate((AudioEnumerator *)api.d.size,local_88);
  QVariant::QVariant((QVariant *)local_108);
  QSettings::value((QString *)local_e8,(QVariant *)settings);
  QVariant::~QVariant((QVariant *)local_108);
  local_10c = AudioEnumerator::deserializeDevice
                        ((AudioEnumerator *)api.d.size,local_88,(QVariant *)local_e8);
  if (local_10c == -1) {
    QMessageLogger::QMessageLogger(&local_138,(char *)0x0,0,(char *)0x0);
    QMessageLogger::warning();
    pQVar4 = QDebug::operator<<(&local_118,"[SoundConfig]");
    QDebug::operator<<(pQVar4,"last configured device not available, using default");
    QDebug::~QDebug(&local_118);
    local_10c = 0;
  }
  setDeviceIndex(this,local_10c);
  iVar2 = samplerate(this);
  QVariant::QVariant(&local_178,iVar2);
  QSettings::value((QString *)&local_158,(QVariant *)settings);
  iVar2 = QVariant::toInt((bool *)&local_158);
  setSamplerate(this,iVar2);
  QVariant::~QVariant(&local_158);
  QVariant::~QVariant(&local_178);
  QVariant::QVariant(&local_1b8,this->mLatency);
  QSettings::value((QString *)&local_198,(QVariant *)settings);
  iVar2 = QVariant::toInt((bool *)&local_198);
  setLatency(this,iVar2);
  QVariant::~QVariant(&local_198);
  QVariant::~QVariant(&local_1b8);
  QVariant::QVariant(&local_1f8,this->mPeriod);
  QSettings::value((QString *)&local_1d8,(QVariant *)settings);
  iVar2 = QVariant::toInt((bool *)&local_1d8);
  setPeriod(this,iVar2);
  QVariant::~QVariant(&local_1d8);
  QVariant::~QVariant(&local_1f8);
  QSettings::endGroup();
  QVariant::~QVariant((QVariant *)local_e8);
  QString::~QString((QString *)local_38);
  return;
}

Assistant:

void SoundConfig::readSettings(QSettings &settings, AudioEnumerator &enumerator) {
    settings.beginGroup(Keys::Sound);

    //
    // Sound configuration notes:
    // If the API cannot be found the first one available is chosen
    // If the device name cannot be found, the default one is chosen
    //

    QString api = settings.value(Keys::api).toString();
    int backend;
    if (api.isEmpty()) {
        backend = 0; // default to first available
    } else {
        backend = enumerator.backendNames().indexOf(api);
        if (backend == -1) {
            qWarning().noquote() << TU::LOG_PREFIX << "audio API" << api << "not available";
            backend = 0; // default to the first one
        }
    }

    setBackendIndex(backend);
    enumerator.populate(backend);

    auto deviceId = settings.value(Keys::deviceId);
    int device = enumerator.deserializeDevice(backend, deviceId);
    if (device == -1) {
        qWarning() << TU::LOG_PREFIX << "last configured device not available, using default";
        device = 0;
    }
    setDeviceIndex(device);

    setSamplerate(settings.value(Keys::samplerate, samplerate()).toInt());
    setLatency(settings.value(Keys::latency, mLatency).toInt());
    setPeriod(settings.value(Keys::period, mPeriod).toInt());

    settings.endGroup();
}